

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Internal::mark_eliminated_clauses_as_garbage
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer pvVar1;
  int lit;
  uint uVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  uint pivot_00;
  Clause *__range1;
  long lVar6;
  ulong uVar7;
  Clause *pCVar8;
  Clause **c;
  pointer ppCVar9;
  Clause *__range1_1;
  long lVar10;
  
  ppCVar3 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar4 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pivot_00 = -pivot;
  uVar2 = pivot;
  if (pivot < 1) {
    uVar2 = pivot_00;
  }
  pvVar1 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (uVar2 << 1 | (uint)pivot >> 0x1f);
  ppCVar9 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = *(pointer *)
             ((long)&(pvVar1->
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                     _M_impl.super__Vector_impl_data + 8);
  if (ppCVar9 != ppCVar5) {
    do {
      pCVar8 = *ppCVar9;
      if ((*(uint *)&pCVar8->field_0x8 & 0x10) == 0) {
        if ((ppCVar4 == ppCVar3) || ((*(uint *)&pCVar8->field_0x8 & 0x20) != 0)) {
          if (this->proof != (Proof *)0x0) {
            Proof::weaken_minus(this->proof,pCVar8);
            pCVar8 = *ppCVar9;
          }
          if (pCVar8->size == 2) {
            *deleted_binary_clause = true;
          }
          External::push_clause_on_extension_stack(this->external,pCVar8,pivot);
          pCVar8 = *ppCVar9;
        }
        mark_garbage(this,pCVar8);
        pCVar8 = *ppCVar9;
        lVar10 = (long)pCVar8->size;
        if (lVar10 != 0) {
          lVar6 = 0;
          do {
            lit = *(int *)((long)&pCVar8[1].field_0 + lVar6);
            if (lit != pivot) {
              elim_update_removed_lit(this,eliminator,lit);
            }
            lVar6 = lVar6 + 4;
          } while (lVar10 * 4 != lVar6);
        }
      }
      ppCVar9 = ppCVar9 + 1;
    } while (ppCVar9 != ppCVar5);
    ppCVar9 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  uVar7 = (long)*(pointer *)
                 ((long)&(pvVar1->
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                         _M_impl.super__Vector_impl_data + 0x10) - (long)ppCVar9;
  if (uVar7 != 0) {
    (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    if (ppCVar9 != (pointer)0x0) {
      operator_delete(ppCVar9,uVar7);
    }
  }
  pvVar1 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (uVar2 << 1 | pivot_00 >> 0x1f);
  ppCVar9 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = *(pointer *)
             ((long)&(pvVar1->
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                     _M_impl.super__Vector_impl_data + 8);
  if (ppCVar9 != ppCVar5) {
    do {
      pCVar8 = *ppCVar9;
      if ((*(uint *)&pCVar8->field_0x8 & 0x10) == 0) {
        if ((ppCVar4 == ppCVar3) || ((*(uint *)&pCVar8->field_0x8 & 0x20) != 0)) {
          if (this->proof != (Proof *)0x0) {
            Proof::weaken_minus(this->proof,pCVar8);
            pCVar8 = *ppCVar9;
          }
          if (pCVar8->size == 2) {
            *deleted_binary_clause = true;
          }
          External::push_clause_on_extension_stack(this->external,pCVar8,pivot_00);
          pCVar8 = *ppCVar9;
        }
        mark_garbage(this,pCVar8);
        pCVar8 = *ppCVar9;
        lVar10 = (long)pCVar8->size;
        if (lVar10 != 0) {
          lVar6 = 0;
          do {
            uVar2 = *(uint *)((long)&pCVar8[1].field_0 + lVar6);
            if (uVar2 != pivot_00) {
              elim_update_removed_lit(this,eliminator,uVar2);
            }
            lVar6 = lVar6 + 4;
          } while (lVar10 * 4 != lVar6);
        }
      }
      ppCVar9 = ppCVar9 + 1;
    } while (ppCVar9 != ppCVar5);
    ppCVar9 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  uVar7 = (long)*(pointer *)
                 ((long)&(pvVar1->
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                         _M_impl.super__Vector_impl_data + 0x10) - (long)ppCVar9;
  if (uVar7 != 0) {
    (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    if (ppCVar9 != (pointer)0x0) {
      operator_delete(ppCVar9,uVar7);
      return;
    }
  }
  return;
}

Assistant:

void Internal::mark_eliminated_clauses_as_garbage (
    Eliminator &eliminator, int pivot, bool &deleted_binary_clause) {
  assert (!unsat);

  LOG ("marking irredundant clauses with %d as garbage", pivot);

  const int64_t substitute = eliminator.gates.size ();
  if (substitute)
    LOG ("pushing %" PRId64 " gate clauses on extension stack", substitute);
#ifndef NDEBUG
  int64_t pushed = 0;
#endif
  Occs &ps = occs (pivot);
  for (const auto &c : ps) {
    if (c->garbage)
      continue;
    assert (!c->redundant);
    if (!substitute || c->gate) {
      if (proof)
        proof->weaken_minus (c);
      if (c->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (c, pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (c);
    elim_update_removed_clause (eliminator, c, pivot);
  }
  erase_occs (ps);

  LOG ("marking irredundant clauses with %d as garbage", -pivot);

  Occs &ns = occs (-pivot);
  for (const auto &d : ns) {
    if (d->garbage)
      continue;
    assert (!d->redundant);
    if (!substitute || d->gate) {
      if (proof)
        proof->weaken_minus (d);
      if (d->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (d, -pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (d);
    elim_update_removed_clause (eliminator, d, -pivot);
  }
  erase_occs (ns);

  if (substitute)
    assert (pushed <= substitute);

  // Unfortunately, we can not use the trick by Niklas Soerensson anymore,
  // which avoids saving all clauses on the extension stack.  This would
  // break our new incremental 'restore' logic.
}